

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m2v.c
# Opt level: O1

void m2v_multadd_row_from(m2v *M1,int r1,int offs,int alpha,m2v *Mt,int rt)

{
  uint *puVar1;
  m2v_base *pmVar2;
  m2v_base *pmVar3;
  long lVar4;
  uint *puVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  if (alpha != 0) {
    lVar4 = (long)r1 * (long)M1->row_stride;
    iVar6 = offs + 0x1f;
    if (-1 < offs) {
      iVar6 = offs;
    }
    iVar6 = iVar6 >> 5;
    iVar9 = Mt->row_stride * rt;
    pmVar2 = M1->e;
    pmVar3 = Mt->e;
    puVar5 = pmVar3 + (iVar9 + iVar6);
    *puVar5 = *puVar5 ^ (pmVar2[(int)lVar4 + iVar6] >> ((byte)offs & 0x1f)) << ((byte)offs & 0x1f);
    lVar7 = (long)Mt->row_stride * ((long)rt + 1);
    iVar9 = iVar9 + iVar6 + 1;
    if (iVar9 < (int)lVar7) {
      lVar8 = (long)iVar9;
      puVar5 = pmVar2 + iVar6 + lVar4;
      do {
        puVar5 = puVar5 + 1;
        puVar1 = pmVar3 + lVar8;
        *puVar1 = *puVar1 ^ *puVar5;
        lVar8 = lVar8 + 1;
      } while (lVar8 < lVar7);
    }
  }
  return;
}

Assistant:

void m2v_multadd_row_from(const m2v* M1,
			int r1,
			int offs,
			int alpha,
			m2v* Mt,
			int rt)
{
	assert(M1->n_col == Mt->n_col);
	assert(0 <= r1 && r1 < M1->n_row);
	assert(0 <= rt && rt < Mt->n_row);
	if (alpha == 0)
		return;

	int o1 = get_word(M1, r1, offs);
	int ot = get_word(Mt, rt, offs);
	/* multadd first partial word */
	{
		const m2v_base m = ~(get_mask(get_bit(Mt, offs)) - 1);
		Mt->e[ot++] ^= M1->e[o1++] & m;
	}

	/* loop over remaining complete words */
	const int oe = get_word(Mt, rt + 1, 0);
	while (ot < oe) {
		Mt->e[ot++] ^= M1->e[o1++];
	}
}